

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  string *config;
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar1;
  string linkLanguage;
  string extraFlags;
  string linkRuleVar;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  bVar1 = requireDeviceLinking
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,
                     (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     config);
  if (bVar1) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY","");
    WriteDeviceLibraryRules(this,&local_a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratorTarget::GetLinkerLanguage
            (&local_a0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable
            (&local_40,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &local_a0,config);
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  cmsys::SystemTools::UpperCase(&local_60,config);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)this_00,&local_80,&local_60,&local_a0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  WriteLibraryRules(this,&local_40,&local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
  if (requiresDeviceLinking) {
    std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
    this->WriteDeviceLibraryRules(linkRuleVar, false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->ConfigName);

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, cmSystemTools::UpperCase(this->ConfigName), linkLanguage,
    this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}